

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O2

CordRep * __thiscall absl::cord_internal::CordRepBtreeNavigator::NextUp(CordRepBtreeNavigator *this)

{
  byte bVar1;
  bool bVar2;
  CordRep *pCVar3;
  CordRepBtree *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t index;
  long lVar7;
  
  if ((ulong)(this->node_[0]->super_CordRep).storage[2] - 1 != (ulong)this->index_[0]) {
    __assert_fail("index_[0] == node_[0]->back()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xe4,"CordRep *absl::cord_internal::CordRepBtreeNavigator::NextUp()");
  }
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->height_;
  if (this->height_ < 1) {
    uVar4 = uVar5;
  }
  do {
    uVar6 = uVar5;
    if (uVar4 == uVar6) {
      return (CordRep *)0x0;
    }
    this_00 = this->node_[uVar6 + 1];
    index = (ulong)this->index_[uVar6 + 1] + 1;
    uVar5 = uVar6 + 1;
  } while (index == (this_00->super_CordRep).storage[2]);
  this->index_[uVar6 + 1] = (uint8_t)index;
  lVar7 = (long)(int)(uVar6 + 1);
  do {
    pCVar3 = CordRepBtree::Edge(this_00,index);
    this_00 = CordRep::btree(pCVar3);
    this->node_[lVar7 + -1] = this_00;
    bVar1 = (this_00->super_CordRep).storage[1];
    index = (size_t)bVar1;
    this->index_[lVar7 + -1] = bVar1;
    bVar2 = 1 < lVar7;
    lVar7 = lVar7 + -1;
  } while (bVar2);
  pCVar3 = CordRepBtree::Edge(this_00,index);
  return pCVar3;
}

Assistant:

inline CordRep* CordRepBtreeNavigator::NextUp() {
  assert(index_[0] == node_[0]->back());
  CordRepBtree* edge;
  size_t index;
  int height = 0;
  do {
    if (++height > height_) return nullptr;
    edge = node_[height];
    index = index_[height] + 1;
  } while (index == edge->end());
  index_[height] = static_cast<uint8_t>(index);
  do {
    node_[--height] = edge = edge->Edge(index)->btree();
    index_[height] = static_cast<uint8_t>(index = edge->begin());
  } while (height > 0);
  return edge->Edge(index);
}